

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RepeatedRemoveDirectory(string *dir)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  bVar2 = cmsys::SystemTools::RemoveADirectory(dir);
  bVar4 = true;
  if (!bVar2) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      cmsys::SystemTools::Delay(100);
      if (uVar3 == 9) break;
      bVar2 = cmsys::SystemTools::RemoveADirectory(dir);
      uVar1 = uVar3 + 1;
    } while (!bVar2);
    bVar4 = uVar3 < 9;
  }
  return bVar4;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const std::string& dir)
{
  // Windows sometimes locks files temporarily so try a few times.
  for (int i = 0; i < 10; ++i) {
    if (cmSystemTools::RemoveADirectory(dir)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }
  return false;
}